

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (Result<CBlockIndex_*> *__return_storage_ptr__,ChainstateManager *this,
          AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  CChainParams *this_00;
  CTxMemPool *this_01;
  size_t sVar5;
  pointer ppCVar6;
  optional<uint256> from_snapshot_blockhash;
  string original;
  path leveldb_name;
  _Head_base<0UL,_Chainstate_*,_false> _Var7;
  __single_object *p_Var8;
  bool bVar9;
  AssumeutxoData *el;
  pointer pAVar10;
  CBlockIndex *pCVar11;
  CBlockIndex *pCVar12;
  unsigned_long uVar13;
  Chainstate *pCVar14;
  CCoinsViewCache *this_02;
  size_t sVar15;
  pointer args;
  ulong uVar16;
  undefined1 *puVar17;
  _Head_base<0UL,_CoinsViews_*,_false> _Var18;
  ulong uVar19;
  long *plVar20;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ChainstateManager *pCVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 in_stack_fffffffffffffa28;
  Result<CBlockIndex_*> *pRVar26;
  CBlockIndex *pCVar27;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  undefined8 uVar28;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffa48;
  _Head_base<0UL,_Chainstate_*,_false> local_598;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  long local_580;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  long *local_568;
  long local_560;
  long local_558 [2];
  undefined1 local_548 [32];
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  Error local_508;
  long *local_4c8;
  long local_4c0;
  long local_4b8 [2];
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Error local_468;
  string heights_formatted;
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  bilingual_str local_388;
  Error local_348;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  undefined1 local_2f8 [16];
  string local_2e8 [16];
  undefined8 local_2d8 [2];
  __index_type local_2c8;
  path local_2c0;
  ChainstateManager *local_298 [2];
  undefined1 local_288 [24];
  CBlockIndex *local_270;
  __native_type local_268;
  _Base_ptr p_Stack_240;
  ChainstateManager *local_238;
  size_t local_230;
  undefined1 local_228 [16];
  Chainstate *local_218;
  CBlockIndex *local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [8];
  CTxMemPool *pCStack_1e0;
  _Head_base<0UL,_CoinsViews_*,_false> local_1d8;
  size_t local_1d0;
  _Head_base<0UL,_Chainstate_*,_false> local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Head_base<0UL,_CoinsViews_*,_false> local_178;
  size_t local_170;
  _Head_base<0UL,_Chainstate_*,_false> local_168;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  undefined1 local_108 [24];
  _Base_ptr local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  time_point local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Base_ptr local_b8;
  size_t local_b0;
  _Base_ptr local_a8 [2];
  _Base_ptr local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 local_70 [24];
  uint256 base_blockhash;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,in_memory);
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  SnapshotBlockhash((optional<uint256> *)&criticalblock44,this);
  if (local_2e8[0] == (string)0x1) {
    local_b8 = (_Base_ptr)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Can\'t activate a snapshot-based chainstate more than once","");
    local_98 = (_Base_ptr)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8,(long)&local_b8->_M_color + local_b0);
    puVar17 = local_70 + 8;
    local_78 = puVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8,(long)&local_b8->_M_color + local_b0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if (local_98 == (_Base_ptr)local_88) {
      *puVar1 = CONCAT71(local_88._1_7_,local_88[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_88._8_8_;
    }
    else {
      *(_Base_ptr *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_88._1_7_,local_88[0]);
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_90;
    local_90 = (_Base_ptr)0x0;
    local_88[0] = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_78 == puVar17) {
      *puVar1 = CONCAT71(local_70._9_7_,local_70[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_70._16_8_;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_70._9_7_,local_70[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_70._0_8_;
    local_70._0_8_ = 0;
    local_70[8] = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_98 = (_Base_ptr)local_88;
    local_78 = puVar17;
    if (local_b8 != (_Base_ptr)local_a8) {
      operator_delete(local_b8,(ulong)((long)&local_a8[0]->_M_color + 1));
    }
    goto LAB_00aea2b9;
  }
  criticalblock43.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock43.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
  this_00 = (this->m_options).chainparams;
  args = (this_00->m_assumeutxo_data).
         super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
         super__Vector_impl_data._M_finish;
  for (pAVar10 = (this_00->m_assumeutxo_data).
                 super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                 super__Vector_impl_data._M_start; pAVar10 != args; pAVar10 = pAVar10 + 1) {
    auVar25[0] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar25[1] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar25[2] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar25[3] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar25[4] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar25[5] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar25[6] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar25[7] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar25[8] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar25[9] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar25[10] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar25[0xb] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar25[0xc] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar25[0xd] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar25[0xe] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar25[0xf] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar22[0] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[0]);
    auVar22[1] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[1] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[1]);
    auVar22[2] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[2] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[2]);
    auVar22[3] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[3] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[3]);
    auVar22[4] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[4] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[4]);
    auVar22[5] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[5] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[5]);
    auVar22[6] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[6] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[6]);
    auVar22[7] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[7] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[7]);
    auVar22[8] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[8] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[8]);
    auVar22[9] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[9] ==
                  base_blockhash.super_base_blob<256U>.m_data._M_elems[9]);
    auVar22[10] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[10] ==
                   base_blockhash.super_base_blob<256U>.m_data._M_elems[10]);
    auVar22[0xb] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar22[0xc] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar22[0xd] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar22[0xe] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar22[0xf] = -((pAVar10->blockhash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar22 = auVar22 & auVar25;
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
      pCVar11 = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,&base_blockhash);
      if (pCVar11 == (CBlockIndex *)0x0) {
        local_178._M_head_impl = (CoinsViews *)&local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,
                   "The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"
                   ,"");
        criticalblock44.super_unique_lock._M_device = (mutex_type *)local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&criticalblock44,local_178._M_head_impl,
                   local_170 + (long)local_178._M_head_impl);
        local_2e8._0_8_ = local_2d8;
        std::__cxx11::string::_M_construct<char*>
                  (local_2e8,local_178._M_head_impl,local_170 + (long)local_178._M_head_impl);
        base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_158,(tinyformat *)&criticalblock44,
                   (bilingual_str *)&criticalblock48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        pCVar21 = (ChainstateManager *)(local_158 + 0x10);
        if ((ChainstateManager *)local_158._0_8_ == pCVar21) {
          *puVar1 = CONCAT71(local_158._17_7_,local_158[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
               local_158._24_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_158._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_158._17_7_,local_158[0x10]);
        }
        puVar17 = local_138 + 0x10;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_158._8_8_;
        local_158._8_8_ = (_Base_ptr)0x0;
        local_158[0x10] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((undefined1 *)local_138._0_8_ == puVar17) {
          *puVar1 = CONCAT71(local_138._17_7_,local_138[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_138._24_8_;
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_138._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_138._17_7_,local_138[0x10]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_138._8_8_;
        local_138._8_8_ = 0;
        local_138[0x10] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_158._0_8_ = pCVar21;
        local_138._0_8_ = puVar17;
        if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3b8) {
          operator_delete(criticalblock48.super_unique_lock._M_device,local_3b8._0_8_ + 1);
        }
        if ((undefined8 *)local_2e8._0_8_ != local_2d8) {
          operator_delete((void *)local_2e8._0_8_,
                          (ulong)((long)&((__pthread_internal_list *)local_2d8[0])->__prev + 1));
        }
        if (criticalblock44.super_unique_lock._M_device != (mutex_type *)local_2f8) {
          operator_delete(criticalblock44.super_unique_lock._M_device,local_2f8._0_8_ + 1);
        }
        _Var18._M_head_impl = local_178._M_head_impl;
        if (local_178._M_head_impl == (CoinsViews *)&local_168) goto LAB_00aea2af;
      }
      else if ((pCVar11->nStatus & 0x60) == 0) {
        if ((this->m_best_header == (CBlockIndex *)0x0) ||
           (pCVar27 = pCVar11,
           pCVar12 = CBlockIndex::GetAncestor(this->m_best_header,pCVar11->nHeight),
           pCVar12 != pCVar11)) {
          local_238 = (ChainstateManager *)local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo."
                     ,"");
          local_218 = (Chainstate *)local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_238,
                     (long)((local_238->m_warningcache)._M_elems + -1) + local_230);
          local_208._16_8_ = local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_208 + 0x10),local_238,
                     (long)((local_238->m_warningcache)._M_elems + -1) + local_230);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
          if (local_218 == (Chainstate *)local_208) {
            *puVar1 = CONCAT71(local_208._1_7_,local_208[0]);
            ((duration *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
                 local_208._8_8_;
          }
          else {
            *(Chainstate **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_218;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
                 CONCAT71(local_208._1_7_,local_208[0]);
          }
          *(CBlockIndex **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_210;
          local_210 = (CBlockIndex *)0x0;
          local_208[0] = '\0';
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
          if ((undefined1 *)local_208._16_8_ == local_1e8) {
            *puVar1 = CONCAT71(local_1e8._1_7_,local_1e8[0]);
            *(CTxMemPool **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                 pCStack_1e0;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                 local_208._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
                 CONCAT71(local_1e8._1_7_,local_1e8[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
               local_208._24_8_;
          local_208._24_8_ = (__pthread_internal_list *)0x0;
          local_1e8[0] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
          local_168._M_head_impl = (Chainstate *)local_228._0_8_;
          _Var18._M_head_impl = (CoinsViews *)local_238;
          local_218 = (Chainstate *)local_208;
          local_208._16_8_ = local_1e8;
          if (local_238 == (ChainstateManager *)local_228) goto LAB_00aea2af;
        }
        else {
          this_01 = this->m_active_chainstate->m_mempool;
          if ((this_01 == (CTxMemPool *)0x0) || (uVar13 = CTxMemPool::size(this_01), uVar13 == 0)) {
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock)
            ;
            criticalblock44.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
            criticalblock44.super_unique_lock._8_8_ =
                 criticalblock44.super_unique_lock._8_8_ & 0xffffffffffffff00;
            std::unique_lock<std::recursive_mutex>::lock(&criticalblock44.super_unique_lock);
            pCVar14 = ActiveChainstate(this);
            sVar15 = pCVar14->m_coinsdb_cache_size_bytes;
            pCVar14 = ActiveChainstate(this);
            sVar5 = pCVar14->m_coinstip_cache_size_bytes;
            pCVar14 = ActiveChainstate(this);
            dVar23 = (double)(long)sVar5 * 0.01;
            uVar16 = (ulong)dVar23;
            dVar24 = (double)(long)sVar15;
            uVar28 = 0;
            uVar19 = (ulong)(dVar24 * 0.01);
            Chainstate::ResizeCoinsCaches
                      (pCVar14,(long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f |
                               uVar16,
                       (long)(dVar24 * 0.01 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19
                      );
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock44.super_unique_lock)
            ;
            criticalblock48.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
            criticalblock48.super_unique_lock._M_owns = false;
            std::unique_lock<std::recursive_mutex>::lock(&criticalblock48.super_unique_lock);
            pCVar14 = (Chainstate *)operator_new(0xe8);
            local_2f8[0] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
            local_2f8[1] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
            local_2f8[2] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
            local_2f8[3] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
            local_2f8[4] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
            local_2f8[5] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
            local_2f8[6] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
            local_2f8[7] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
            local_2f8[8] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
            local_2f8[9] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
            local_2f8[10] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
            local_2f8[0xb] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
            local_2f8[0xc] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
            local_2f8[0xd] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
            local_2f8[0xe] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
            local_2f8[0xf] = base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
            criticalblock44.super_unique_lock._M_device =
                 (mutex_type *)base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
            criticalblock44.super_unique_lock._M_owns =
                 (bool)base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
            criticalblock44.super_unique_lock._9_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
            criticalblock44.super_unique_lock._10_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
            criticalblock44.super_unique_lock._11_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
            criticalblock44.super_unique_lock._12_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
            criticalblock44.super_unique_lock._13_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
            criticalblock44.super_unique_lock._14_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
            criticalblock44.super_unique_lock._15_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
            local_2e8[0] = (string)0x1;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._8_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._9_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._10_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._11_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._12_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._13_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._14_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._15_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._0_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._1_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[1];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._2_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[2];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._3_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[3];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._4_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[4];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._5_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[5];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._6_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[6];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._7_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[7];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._16_4_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems._16_4_;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._20_4_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems._20_4_;
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._24_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._25_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._26_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._27_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._28_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._29_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._30_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload._31_1_ =
                 base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
            from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged = true;
            Chainstate::Chainstate
                      (pCVar14,(CTxMemPool *)0x0,&this->m_blockman,this,from_snapshot_blockhash);
            local_598._M_head_impl = pCVar14;
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock48.super_unique_lock)
            ;
            criticalblock44.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
            criticalblock44.super_unique_lock._8_8_ =
                 criticalblock44.super_unique_lock._8_8_ & 0xffffffffffffff00;
            std::unique_lock<std::recursive_mutex>::lock(&criticalblock44.super_unique_lock);
            _Var7._M_head_impl = local_598._M_head_impl;
            criticalblock48.super_unique_lock._M_device = (mutex_type *)0xf55c56;
            pRVar26 = __return_storage_ptr__;
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      (&local_2c0,(char **)&criticalblock48,auto_format);
            uVar16 = (ulong)(dVar24 * 0.99);
            leveldb_name.super_path._M_pathname._M_string_length = (size_type)pCVar27;
            leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)pRVar26;
            leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)dVar24;
            leveldb_name.super_path._M_pathname.field_2._8_8_ = uVar28;
            leveldb_name.super_path._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              )in_stack_fffffffffffffa48._M_head_impl;
            Chainstate::InitCoinsDB
                      (_Var7._M_head_impl,
                       (long)(dVar24 * 0.99 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16
                       ,in_memory,false,leveldb_name);
            std::filesystem::__cxx11::path::~path(&local_2c0);
            dVar23 = (double)(long)sVar5 * 0.99;
            uVar16 = (ulong)dVar23;
            Chainstate::InitCoinsCache
                      (local_598._M_head_impl,
                       (long)(dVar23 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16);
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock44.super_unique_lock)
            ;
            cleanup_bad_snapshot.snapshot_chainstate = (__single_object *)&local_598;
            cleanup_bad_snapshot.this = this;
            PopulateAndValidateSnapshot
                      ((Result<void> *)&criticalblock44,this,local_598._M_head_impl,coins_file,
                       metadata);
            if (local_2c8 == '\x01') {
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)
                                &criticalblock44);
              criticalblock48.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
              criticalblock48.super_unique_lock._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&criticalblock48.super_unique_lock);
              pCVar14 = ActiveChainstate(this);
              ppCVar6 = (pCVar14->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppCVar6 ==
                  (pCVar14->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pCVar11 = (CBlockIndex *)0x0;
              }
              else {
                pCVar11 = ppCVar6[-1];
              }
              ppCVar6 = ((local_598._M_head_impl)->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppCVar6 ==
                  ((local_598._M_head_impl)->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pCVar12 = (CBlockIndex *)0x0;
              }
              else {
                pCVar12 = ppCVar6[-1];
              }
              bVar9 = ::node::CBlockIndexWorkComparator::operator()
                                ((CBlockIndexWorkComparator *)&criticalblock44,pCVar11,pCVar12);
              if (bVar9) {
                if ((in_memory) ||
                   (bVar9 = ::node::WriteSnapshotBaseBlockhash(local_598._M_head_impl), bVar9)) {
                  _Var7._M_head_impl = local_598._M_head_impl;
                  if ((this->m_snapshot_chainstate)._M_t.
                      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)
                  {
                    __assert_fail("!m_snapshot_chainstate",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0x1696,
                                  "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                                 );
                  }
                  (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = local_598._M_head_impl;
                  local_598._M_head_impl = (Chainstate *)0x0;
                  bVar9 = Chainstate::LoadChainTip(_Var7._M_head_impl);
                  if (!bVar9) {
                    __assert_fail("chaintip_loaded",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0x1699,
                                  "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                                 );
                  }
                  uVar13 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
                  criticalblock44.super_unique_lock._M_device =
                       (mutex_type *)
                       CONCAT71(criticalblock44.super_unique_lock._M_device._1_7_,uVar13 == 0);
                  inline_assertion_check<true,bool>
                            ((bool *)&criticalblock44,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                             ,0x169d,"ActivateSnapshot",
                             "m_active_chainstate->m_mempool->size() == 0");
                  criticalblock44.super_unique_lock._M_device =
                       (mutex_type *)
                       CONCAT71(criticalblock44.super_unique_lock._M_device._1_7_,
                                ((this->m_snapshot_chainstate)._M_t.
                                 super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                 .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->
                                m_mempool == (CTxMemPool *)0x0);
                  inline_assertion_check<true,bool>
                            ((bool *)&criticalblock44,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                             ,0x169e,"ActivateSnapshot","!m_snapshot_chainstate->m_mempool");
                  pCVar14 = this->m_active_chainstate;
                  ((this->m_snapshot_chainstate)._M_t.
                   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool =
                       pCVar14->m_mempool;
                  pCVar14->m_mempool = (CTxMemPool *)0x0;
                  pCVar14 = (this->m_snapshot_chainstate)._M_t.
                            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t
                            .super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
                  this->m_active_chainstate = pCVar14;
                  if ((pCVar14 == (Chainstate *)0x0) ||
                     (pCVar11 = Chainstate::SnapshotBase(pCVar14), pCVar11 == (CBlockIndex *)0x0)) {
                    uVar16 = 0;
                    uVar19 = 0;
                  }
                  else {
                    uVar19 = (ulong)(uint)pCVar11->nHeight;
                    uVar16 = 0x100000000;
                  }
                  (this->m_blockman).m_snapshot_height.super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int> =
                       (_Optional_payload_base<int>)(uVar16 | uVar19);
                  base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock44,&base_blockhash);
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ;
                  source_file._M_len = 0x5e;
                  logging_function._M_str = "ActivateSnapshot";
                  logging_function._M_len = 0x10;
                  LogPrintFormatInternal<std::__cxx11::string>
                            (logging_function,source_file,0x16a4,ALL,Info,
                             (ConstevalFormatString<1U>)0xfb3e6e,(string *)&criticalblock44);
                  if (criticalblock44.super_unique_lock._M_device != (mutex_type *)local_2f8) {
                    operator_delete(criticalblock44.super_unique_lock._M_device,local_2f8._0_8_ + 1)
                    ;
                  }
                  this_02 = Chainstate::CoinsTip
                                      ((this->m_snapshot_chainstate)._M_t.
                                       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                       .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
                  sVar15 = CCoinsViewCache::DynamicMemoryUsage(this_02);
                  criticalblock44.super_unique_lock._M_device = (mutex_type *)(sVar15 / 1000000);
                  source_file_00._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ;
                  source_file_00._M_len = 0x5e;
                  logging_function_00._M_str = "ActivateSnapshot";
                  logging_function_00._M_len = 0x10;
                  LogPrintFormatInternal<unsigned_long>
                            (logging_function_00,source_file_00,0x16a6,ALL,Info,
                             (ConstevalFormatString<1U>)0xfb3e9d,(unsigned_long *)&criticalblock44);
                  MaybeRebalanceCaches(this);
                  *(CBlockIndex **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = pCVar27;
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) =
                       '\x01';
                }
                else {
                  local_568 = local_558;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_568,"could not write base blockhash","");
                  local_548._0_8_ = local_548 + 0x10;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_548,local_568,local_560 + (long)local_568);
                  local_528._M_p = (pointer)&local_518;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_528,local_568,local_560 + (long)local_568);
                  ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                            (&local_508,&cleanup_bad_snapshot,(bilingual_str *)local_548);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10
                           );
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
                  paVar2 = &local_508.message.original.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_508.message.original._M_dataplus._M_p == paVar2) {
                    *puVar1 = CONCAT71(local_508.message.original.field_2._M_allocated_capacity.
                                       _1_7_,local_508.message.original.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                         local_508.message.original.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
                         local_508.message.original._M_dataplus._M_p;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                              0x10) =
                         CONCAT71(local_508.message.original.field_2._M_allocated_capacity._1_7_,
                                  local_508.message.original.field_2._M_local_buf[0]);
                  }
                  paVar3 = &local_508.message.translated.field_2;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                       local_508.message.original._M_string_length;
                  local_508.message.original._M_string_length = 0;
                  local_508.message.original.field_2._M_local_buf[0] = '\0';
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30
                           );
                  *(undefined8 **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                       puVar1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_508.message.translated._M_dataplus._M_p == paVar3) {
                    *puVar1 = CONCAT71(local_508.message.translated.field_2._M_allocated_capacity.
                                       _1_7_,local_508.message.translated.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                         local_508.message.translated.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_CBlockIndex_*>.
                             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                         local_508.message.translated._M_dataplus._M_p;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                              0x30) =
                         CONCAT71(local_508.message.translated.field_2._M_allocated_capacity._1_7_,
                                  local_508.message.translated.field_2._M_local_buf[0]);
                  }
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                       local_508.message.translated._M_string_length;
                  local_508.message.translated._M_string_length = 0;
                  local_508.message.translated.field_2._M_local_buf[0] = '\0';
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0'
                  ;
                  local_508.message.original._M_dataplus._M_p = (pointer)paVar2;
                  local_508.message.translated._M_dataplus._M_p = (pointer)paVar3;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_p != &local_518) {
                    operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
                    operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
                  }
                  local_4b8[0] = local_558[0];
                  plVar20 = local_568;
                  if (local_568 != local_558) goto LAB_00aead05;
                }
              }
              else {
                local_4c8 = local_4b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4c8,"work does not exceed active chainstate","");
                local_4a8._0_8_ = local_4a8 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_4a8,local_4c8,local_4c0 + (long)local_4c8);
                local_488._M_p = (pointer)&local_478;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_488,local_4c8,local_4c0 + (long)local_4c8);
                ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                          (&local_468,&cleanup_bad_snapshot,(bilingual_str *)local_4a8);
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
                *(undefined8 **)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
                paVar2 = &local_468.message.original.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468.message.original._M_dataplus._M_p == paVar2) {
                  *puVar1 = CONCAT71(local_468.message.original.field_2._M_allocated_capacity._1_7_,
                                     local_468.message.original.field_2._M_local_buf[0]);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                       local_468.message.original.field_2._8_8_;
                }
                else {
                  *(pointer *)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
                       local_468.message.original._M_dataplus._M_p;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                            0x10) =
                       CONCAT71(local_468.message.original.field_2._M_allocated_capacity._1_7_,
                                local_468.message.original.field_2._M_local_buf[0]);
                }
                paVar3 = &local_468.message.translated.field_2;
                *(size_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                     local_468.message.original._M_string_length;
                local_468.message.original._M_string_length = 0;
                local_468.message.original.field_2._M_local_buf[0] = '\0';
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
                *(undefined8 **)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468.message.translated._M_dataplus._M_p == paVar3) {
                  *puVar1 = CONCAT71(local_468.message.translated.field_2._M_allocated_capacity.
                                     _1_7_,local_468.message.translated.field_2._M_local_buf[0]);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                       local_468.message.translated.field_2._8_8_;
                }
                else {
                  *(pointer *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                       local_468.message.translated._M_dataplus._M_p;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> +
                            0x30) =
                       CONCAT71(local_468.message.translated.field_2._M_allocated_capacity._1_7_,
                                local_468.message.translated.field_2._M_local_buf[0]);
                }
                *(size_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                     local_468.message.translated._M_string_length;
                local_468.message.translated._M_string_length = 0;
                local_468.message.translated.field_2._M_local_buf[0] = '\0';
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
                local_468.message.original._M_dataplus._M_p = (pointer)paVar2;
                local_468.message.translated._M_dataplus._M_p = (pointer)paVar3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_p != &local_478) {
                  operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
                  operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
                }
                plVar20 = local_4c8;
                if (local_4c8 != local_4b8) {
LAB_00aead05:
                  operator_delete(plVar20,local_4b8[0] + 1);
                }
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        (&criticalblock48.super_unique_lock);
            }
            else {
              criticalblock43.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
              criticalblock43.super_unique_lock._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
              local_3e8 = local_3d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3e8,"Population failed: %s","");
              criticalblock48.super_unique_lock._M_device = (mutex_type *)local_3b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&criticalblock48,local_3e8,local_3e0 + (long)local_3e8);
              local_3b8._16_8_ = &local_398;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_3b8 + 0x10),local_3e8,local_3e0 + (long)local_3e8);
              util::ErrorString<void>
                        ((bilingual_str *)&heights_formatted,(Result<void> *)&criticalblock44);
              tinyformat::format<bilingual_str>
                        (&local_388,(bilingual_str *)&criticalblock48,
                         (bilingual_str *)&heights_formatted);
              ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                        (&local_348,&cleanup_bad_snapshot,&local_388);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_CBlockIndex_*>.
                               super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_CBlockIndex_*>.
                super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
              paVar2 = &local_348.message.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.message.original._M_dataplus._M_p == paVar2) {
                *puVar1 = CONCAT71(local_348.message.original.field_2._M_allocated_capacity._1_7_,
                                   local_348.message.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
                     local_348.message.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
                     local_348.message.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10)
                     = CONCAT71(local_348.message.original.field_2._M_allocated_capacity._1_7_,
                                local_348.message.original.field_2._M_local_buf[0]);
              }
              paVar3 = &local_348.message.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
                   local_348.message.original._M_string_length;
              local_348.message.original._M_string_length = 0;
              local_348.message.original.field_2._M_local_buf[0] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_CBlockIndex_*>.
                               super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.message.translated._M_dataplus._M_p == paVar3) {
                *puVar1 = CONCAT71(local_348.message.translated.field_2._M_allocated_capacity._1_7_,
                                   local_348.message.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                     local_348.message.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                     local_348.message.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30)
                     = CONCAT71(local_348.message.translated.field_2._M_allocated_capacity._1_7_,
                                local_348.message.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
                   local_348.message.translated._M_string_length;
              local_348.message.translated._M_string_length = 0;
              local_348.message.translated.field_2._M_local_buf[0] = '\0';
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
              local_348.message.original._M_dataplus._M_p = (pointer)paVar2;
              local_348.message.translated._M_dataplus._M_p = (pointer)paVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388.translated._M_dataplus._M_p != &local_388.translated.field_2) {
                operator_delete(local_388.translated._M_dataplus._M_p,
                                local_388.translated.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388.original._M_dataplus._M_p != &local_388.original.field_2) {
                operator_delete(local_388.original._M_dataplus._M_p,
                                local_388.original.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_p != &local_3f8) {
                operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)heights_formatted._M_dataplus._M_p != &heights_formatted.field_2) {
                operator_delete(heights_formatted._M_dataplus._M_p,
                                heights_formatted.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._16_8_ != &local_398) {
                operator_delete((void *)local_3b8._16_8_,
                                (ulong)(local_398._M_allocated_capacity + 1));
              }
              if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3b8) {
                operator_delete(criticalblock48.super_unique_lock._M_device,local_3b8._0_8_ + 1);
              }
              if (local_3e8 != local_3d8) {
                operator_delete(local_3e8,local_3d8[0] + 1);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        (&criticalblock43.super_unique_lock);
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)
                                &criticalblock44);
            }
            if (local_598._M_head_impl != (Chainstate *)0x0) {
              std::default_delete<Chainstate>::operator()
                        ((default_delete<Chainstate> *)&local_598,local_598._M_head_impl);
            }
            goto LAB_00aea2b9;
          }
          local_298[0] = (ChainstateManager *)local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Can\'t activate a snapshot when mempool not empty","");
          original._M_string_length = (size_type)pCVar27;
          original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa28;
          original.field_2._M_allocated_capacity = in_stack_fffffffffffffa38;
          original.field_2._8_8_ = in_stack_fffffffffffffa40;
          Untranslated((bilingual_str *)(local_288 + 0x10),original);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
          if ((__native_type *)local_288._16_8_ == &local_268) {
            *puVar1 = CONCAT71(local_268.__align._1_7_,local_268.__size[0]);
            ((duration *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
                 local_268._8_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_288._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
                 CONCAT71(local_268.__align._1_7_,local_268.__size[0]);
          }
          *(CBlockIndex **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_270;
          local_270 = (CBlockIndex *)0x0;
          local_268.__size[0] = '\0';
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_CBlockIndex_*>.
                           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
          if ((char *)local_268._16_8_ == local_268.__size + 0x20) {
            *puVar1 = CONCAT71(local_268._33_7_,local_268.__size[0x20]);
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
                 p_Stack_240;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
                 local_268._16_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_CBlockIndex_*>.
                              super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                              super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                              super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
                 CONCAT71(local_268._33_7_,local_268.__size[0x20]);
          }
          *(__pthread_internal_list **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
               local_268.__data.__list.__prev;
          local_268.__data.__list.__prev = (__pthread_internal_list *)0x0;
          local_268.__size[0x20] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
          local_288._16_8_ = &local_268;
          local_268._16_8_ = local_268.__size + 0x20;
          util::Error::~Error((Error *)(local_288 + 0x10));
          local_168._M_head_impl = (Chainstate *)local_288._0_8_;
          _Var18._M_head_impl = (CoinsViews *)local_298[0];
          if (local_298[0] == (ChainstateManager *)local_288) goto LAB_00aea2af;
        }
      }
      else {
        local_1d8._M_head_impl = (CoinsViews *)&local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"The base block header (%s) is part of an invalid chain","")
        ;
        criticalblock44.super_unique_lock._M_device = (mutex_type *)local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&criticalblock44,local_1d8._M_head_impl,
                   local_1d0 + (long)local_1d8._M_head_impl);
        local_2e8._0_8_ = local_2d8;
        std::__cxx11::string::_M_construct<char*>
                  (local_2e8,local_1d8._M_head_impl,local_1d0 + (long)local_1d8._M_head_impl);
        base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_1b8,(tinyformat *)&criticalblock44,
                   (bilingual_str *)&criticalblock48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        if ((Chainstate *)local_1b8._0_8_ == (Chainstate *)local_1a8) {
          *puVar1 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
          ((duration *)
          ((long)&(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
               local_1a8._8_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_1b8._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_1a8._1_7_,local_1a8[0]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_1b8._8_8_;
        local_1b8._8_8_ = (CBlockIndex *)0x0;
        local_1a8[0] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._16_8_ == &local_188) {
          *puVar1 = CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_188._8_8_;
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_1a8._16_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_1a8._24_8_;
        local_1a8._24_8_ = (__pthread_internal_list *)0x0;
        local_188._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_1b8._0_8_ = (Chainstate *)local_1a8;
        local_1a8._16_8_ = &local_188;
        if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3b8) {
          operator_delete(criticalblock48.super_unique_lock._M_device,local_3b8._0_8_ + 1);
        }
        if ((undefined8 *)local_2e8._0_8_ != local_2d8) {
          operator_delete((void *)local_2e8._0_8_,
                          (ulong)((long)&((__pthread_internal_list *)local_2d8[0])->__prev + 1));
        }
        if (criticalblock44.super_unique_lock._M_device != (mutex_type *)local_2f8) {
          operator_delete(criticalblock44.super_unique_lock._M_device,local_2f8._0_8_ + 1);
        }
        local_168._M_head_impl = local_1c8._M_head_impl;
        _Var18._M_head_impl = local_1d8._M_head_impl;
        if (local_1d8._M_head_impl == (CoinsViews *)&local_1c8) goto LAB_00aea2af;
      }
      puVar17 = (undefined1 *)((long)local_168._M_head_impl + 1);
      goto LAB_00aea2aa;
    }
  }
  CChainParams::GetAvailableSnapshotHeights
            ((vector<int,_std::allocator<int>_> *)&cleanup_bad_snapshot,this_00);
  p_Var8 = cleanup_bad_snapshot.snapshot_chainstate;
  criticalblock44.super_unique_lock._M_device = (mutex_type *)local_2f8;
  criticalblock44.super_unique_lock._M_owns = false;
  criticalblock44.super_unique_lock._9_7_ = 0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  if (cleanup_bad_snapshot.this == (ChainstateManager *)cleanup_bad_snapshot.snapshot_chainstate) {
LAB_00ae9c29:
    heights_formatted._M_dataplus._M_p = (pointer)&heights_formatted.field_2;
    heights_formatted.field_2._8_8_ = local_2f8._8_8_;
  }
  else {
    bVar9 = true;
    pCVar21 = cleanup_bad_snapshot.this;
    do {
      if (!bVar9) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock44,", ");
      }
      util::ToString<int>((string *)&criticalblock48,(int *)pCVar21);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &criticalblock44,(char *)criticalblock48.super_unique_lock._M_device,
                 CONCAT71(criticalblock48.super_unique_lock._9_7_,
                          criticalblock48.super_unique_lock._M_owns));
      if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3b8) {
        operator_delete(criticalblock48.super_unique_lock._M_device,local_3b8._0_8_ + 1);
      }
      pCVar21 = (ChainstateManager *)
                ((long)&(pCVar21->m_ibd_chainstate)._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 4);
      bVar9 = false;
    } while (pCVar21 != (ChainstateManager *)p_Var8);
    if (criticalblock44.super_unique_lock._M_device == (mutex_type *)local_2f8) goto LAB_00ae9c29;
    heights_formatted._M_dataplus._M_p = (pointer)criticalblock44.super_unique_lock._M_device;
  }
  heights_formatted._M_string_length = criticalblock44.super_unique_lock._8_8_;
  heights_formatted.field_2._M_allocated_capacity = local_2f8._0_8_;
  local_118 = (_Base_ptr)local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"
             ,"");
  criticalblock44.super_unique_lock._M_device = (mutex_type *)local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&criticalblock44,local_118,
             (undefined1 *)((long)&local_118->_M_color + local_110));
  local_2e8._0_8_ = local_2d8;
  std::__cxx11::string::_M_construct<char*>
            (local_2e8,local_118,(undefined1 *)((long)&local_118->_M_color + local_110));
  base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((bilingual_str *)(local_108 + 0x10),(tinyformat *)&criticalblock44,
             (bilingual_str *)&criticalblock48,&heights_formatted,args_1);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._16_8_ == &local_e8) {
    *puVar1 = CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_e8._8_8_;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_108._16_8_;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
         CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
  }
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_f0;
  local_f0 = (_Base_ptr)0x0;
  local_e8._M_local_buf[0] = '\0';
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
  *(undefined8 **)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
  if (local_d8 == &local_c8) {
    *puVar1 = CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_c8._8_8_;
  }
  else {
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_d8;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_CBlockIndex_*>.
                      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
  }
  ((duration *)
  ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28))->__r =
       (rep)local_d0.__d.__r;
  local_d0.__d.__r = (duration)0;
  local_c8._M_local_buf[0] = '\0';
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
           super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
           super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
           super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
  local_108._16_8_ = &local_e8;
  local_d8 = &local_c8;
  if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3b8) {
    operator_delete(criticalblock48.super_unique_lock._M_device,local_3b8._0_8_ + 1);
  }
  if ((undefined8 *)local_2e8._0_8_ != local_2d8) {
    operator_delete((void *)local_2e8._0_8_,
                    (ulong)((long)&((__pthread_internal_list *)local_2d8[0])->__prev + 1));
  }
  if (criticalblock44.super_unique_lock._M_device != (mutex_type *)local_2f8) {
    operator_delete(criticalblock44.super_unique_lock._M_device,local_2f8._0_8_ + 1);
  }
  if (local_118 != (_Base_ptr)local_108) {
    operator_delete(local_118,local_108._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)heights_formatted._M_dataplus._M_p != &heights_formatted.field_2) {
    operator_delete(heights_formatted._M_dataplus._M_p,
                    heights_formatted.field_2._M_allocated_capacity + 1);
  }
  if (cleanup_bad_snapshot.this != (ChainstateManager *)0x0) {
    puVar17 = (undefined1 *)(local_580 - (long)cleanup_bad_snapshot.this);
    _Var18._M_head_impl = (CoinsViews *)cleanup_bad_snapshot.this;
LAB_00aea2aa:
    operator_delete(_Var18._M_head_impl,(ulong)puVar17);
  }
LAB_00aea2af:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
LAB_00aea2b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }